

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<short>::test_one<(libdivide::Branching)0>
          (DivideTest<short> *this,short numer,short denom,
          divider<short,_(libdivide::Branching)0> *the_divider)

{
  byte bVar1;
  sbyte sVar2;
  uint uVar3;
  short sVar4;
  ushort uVar5;
  int32_t xl;
  string_class result;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40 [4];
  
  if (denom != -1 || numer != -0x8000) {
    sVar4 = (the_divider->div).denom.magic;
    bVar1 = (the_divider->div).denom.more;
    uVar3 = bVar1 & 0x1f;
    if (sVar4 == 0) {
      sVar2 = ((byte)uVar3 < 0x21) * (' ' - (byte)uVar3);
      uVar5 = 0xffff;
      if (-1 < (char)bVar1) {
        uVar5 = 0;
      }
      sVar4 = ((ushort)((int)(short)(numer + (short)((((uint)(int)numer >> 0xf) << sVar2) >> sVar2))
                       >> uVar3) ^ uVar5) - uVar5;
    }
    else {
      sVar4 = (short)((uint)((int)sVar4 * (int)numer) >> 0x10);
      if ((bVar1 & 0x40) != 0) {
        sVar4 = (sVar4 - ((char)bVar1 >> 7)) + (numer ^ (char)bVar1 >> 7);
      }
      sVar4 = (short)((int)sVar4 >> uVar3) - (sVar4 >> 0xf);
    }
    if (sVar4 != numer / denom) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failure for ",0xc);
      local_50 = local_40;
      local_40[0] = 0x363173;
      local_48 = 3;
      std::operator<<((ostream *)&std::cerr,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,numer);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,denom);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,numer / denom);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,sVar4);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }